

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int64_t HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                      int64_t threshold)

{
  int iVar1;
  HistogramPair *pHVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  HistoQueue *in_RDI;
  int tmp;
  HistogramPair pair;
  VP8LHistogram *h2;
  VP8LHistogram *h1;
  int64_t in_stack_ffffffffffffffb8;
  VP8LHistogram *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  int64_t local_8;
  
  if (in_RDI->size == in_RDI->max_size) {
    local_8 = 0;
  }
  else {
    local_20 = in_ECX;
    local_1c = in_EDX;
    if (in_ECX < in_EDX) {
      local_20 = in_EDX;
      local_1c = in_ECX;
    }
    iVar1 = HistoQueueUpdatePair
                      (*(VP8LHistogram **)(in_RSI + (long)local_20 * 8),in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8,(HistogramPair *)CONCAT44(local_20,local_1c));
    if (iVar1 == 0) {
      local_8 = 0;
    }
    else {
      iVar1 = in_RDI->size;
      in_RDI->size = iVar1 + 1;
      pHVar2 = in_RDI->queue + iVar1;
      pHVar2->idx1 = local_1c;
      pHVar2->idx2 = local_20;
      pHVar2->cost_diff = in_stack_ffffffffffffffb8;
      pHVar2->cost_combo = (uint64_t)in_stack_ffffffffffffffc0;
      HistoQueueUpdateHead(in_RDI,in_RDI->queue + (in_RDI->size + -1));
      local_8 = in_stack_ffffffffffffffb8;
    }
  }
  return local_8;
}

Assistant:

static int64_t HistoQueuePush(HistoQueue* const histo_queue,
                              VP8LHistogram** const histograms, int idx1,
                              int idx2, int64_t threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0;
  assert(threshold <= 0);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  // Do not even consider the pair if it does not improve the entropy.
  if (!HistoQueueUpdatePair(h1, h2, threshold, &pair)) return 0;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}